

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

void __thiscall dynamicgraph::Signal<double,_int>::Signal(Signal<double,_int> *this,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  Signal<double,_int> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  SignalBase<int>::SignalBase(&this->super_SignalBase<int>,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_00168e88;
  this->signalType = CONSTANT;
  this->Tcopy1 = 0.0;
  this->Tcopy2 = 0.0;
  this->Tcopy = &this->Tcopy1;
  this->Treference = (double *)0x0;
  this->TreferenceNonConst = (double *)0x0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 8) = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 0x10) = 0;
  (this->Tfunction).super_function_base.vtable = (vtable_base *)0x0;
  *(undefined8 *)&(this->Tfunction).super_function_base.functor = 0;
  boost::function2<double_&,_double_&,_int>::function2(&this->Tfunction);
  this->keepReference = false;
  this->providerMutex = (Mutex *)0x0;
  return;
}

Assistant:

Signal<T, Time>::Signal(std::string name)
    : __SIGNAL_INIT(name, T(), NULL, NULL, NULL) {
  return;
}